

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O1

uint __thiscall JITTimeWorkItem::GetLoopNumber(JITTimeWorkItem *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->m_workItemData->type != '\x01') && (this->m_workItemData->loopNumber != 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                       ,0x1f,
                       "(IsLoopBody() || m_workItemData->loopNumber == Js::LoopHeader::NoLoop)",
                       "IsLoopBody() || m_workItemData->loopNumber == Js::LoopHeader::NoLoop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return this->m_workItemData->loopNumber;
}

Assistant:

uint
JITTimeWorkItem::GetLoopNumber() const
{
    Assert(IsLoopBody() || m_workItemData->loopNumber == Js::LoopHeader::NoLoop);
    return m_workItemData->loopNumber;
}